

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecryptionHelper.cpp
# Opt level: O2

bool HasCryptFilterDefinition(PDFParser *inParser,PDFStreamInput *inStream)

{
  PDFObject *this;
  bool bVar1;
  EPDFObjectType EVar2;
  PDFDictionary *inDictionary;
  PDFName *pPVar3;
  unsigned_long uVar4;
  PDFObject *inOriginal;
  string *psVar5;
  ulong i;
  RefCountPtr<PDFObject> filterObject;
  PDFObjectCastPtr<PDFName> filterObjectItem;
  RefCountPtr<PDFDictionary> streamDictionary;
  allocator<char> local_71;
  RefCountPtr<PDFObject> local_70;
  string local_60;
  RefCountPtr<PDFDictionary> local_40;
  
  inDictionary = PDFStreamInput::QueryStreamDictionary(inStream);
  local_40._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036d830;
  local_40.mValue = inDictionary;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Filter",&local_71);
  pPVar3 = (PDFName *)PDFParser::QueryDictionaryObject(inParser,inDictionary,&local_60);
  local_70._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036d890;
  local_70.mValue = (PDFObject *)pPVar3;
  std::__cxx11::string::~string((string *)&local_60);
  if (pPVar3 != (PDFName *)0x0) {
    EVar2 = PDFObject::GetType((PDFObject *)pPVar3);
    this = local_70.mValue;
    if (EVar2 == ePDFObjectArray) {
      bVar1 = false;
      i = 0;
      do {
        uVar4 = PDFArray::GetLength((PDFArray *)this);
        if ((uVar4 <= i) || (bVar1 != false)) break;
        inOriginal = PDFArray::QueryObject((PDFArray *)this,i);
        pPVar3 = PDFObjectCast<PDFName>(inOriginal);
        local_60._M_dataplus._M_p = (pointer)&PTR__RefCountPtr_0036d998;
        local_60._M_string_length = (size_type)pPVar3;
        if (pPVar3 != (PDFName *)0x0) {
          psVar5 = PDFName::GetValue_abi_cxx11_(pPVar3);
          bVar1 = std::operator==(psVar5,"Crypt");
        }
        RefCountPtr<PDFName>::~RefCountPtr((RefCountPtr<PDFName> *)&local_60);
        i = i + 1;
      } while (pPVar3 != (PDFName *)0x0);
      goto LAB_001cc157;
    }
    EVar2 = PDFObject::GetType(local_70.mValue);
    if (EVar2 == ePDFObjectName) {
      psVar5 = PDFName::GetValue_abi_cxx11_((PDFName *)local_70.mValue);
      bVar1 = std::operator==(psVar5,"Crypt");
      goto LAB_001cc157;
    }
  }
  bVar1 = false;
LAB_001cc157:
  RefCountPtr<PDFObject>::~RefCountPtr(&local_70);
  RefCountPtr<PDFDictionary>::~RefCountPtr(&local_40);
  return bVar1;
}

Assistant:

bool HasCryptFilterDefinition(PDFParser* inParser, PDFStreamInput* inStream) {
	RefCountPtr<PDFDictionary> streamDictionary(inStream->QueryStreamDictionary());

	// check if stream has a crypt filter
	RefCountPtr<PDFObject> filterObject(inParser->QueryDictionaryObject(streamDictionary.GetPtr(), "Filter"));
	if (!filterObject)
	{
		// no filter, so stop here
		return false;
	}

	if (filterObject->GetType() == PDFObject::ePDFObjectArray)
	{
		PDFArray* filterObjectArray = (PDFArray*)filterObject.GetPtr();
		bool foundCrypt = false;
		for (unsigned long i = 0; i < filterObjectArray->GetLength() && !foundCrypt; ++i)
		{
			PDFObjectCastPtr<PDFName> filterObjectItem(filterObjectArray->QueryObject(i));
			if (!filterObjectItem)
			{
				// error
				break;
			}
			foundCrypt = filterObjectItem->GetValue() == "Crypt";
		}
		return foundCrypt;
	}
	else if (filterObject->GetType() == PDFObject::ePDFObjectName)
	{
		return ((PDFName*)(filterObject.GetPtr()))->GetValue() == "Crypt";
	}
	else
		return false; //???
}